

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O3

void __thiscall
ApprovalTests::ExistingFileNamer::ExistingFileNamer(ExistingFileNamer *this,ExistingFileNamer *x)

{
  pointer pcVar1;
  
  (this->super_ApprovalNamer)._vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_001d2628;
  (this->filePath)._M_dataplus._M_p = (pointer)&(this->filePath).field_2;
  pcVar1 = (x->filePath)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filePath,pcVar1,pcVar1 + (x->filePath)._M_string_length);
  this->options_ = x->options_;
  return;
}

Assistant:

ExistingFileNamer::ExistingFileNamer(const ExistingFileNamer& x)
        : filePath(x.filePath), options_(x.options_)
    {
    }